

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute_acl(archive_read *a,tar *tar,archive_entry *entry,char *value,wchar_t type)

{
  wchar_t wVar1;
  archive_string_conv *paVar2;
  archive_acl *acl;
  char *pcVar3;
  
  if (type == L'Ā') {
    pcVar3 = "SCHILY.acl.access";
  }
  else if (type == L'㰀') {
    pcVar3 = "SCHILY.acl.ace";
  }
  else {
    if (type != L'Ȁ') {
      archive_set_error(&a->archive,-1,"Unknown ACL type: %d",type);
      return L'\xffffffe2';
    }
    pcVar3 = "SCHILY.acl.default";
  }
  if (tar->sconv_acl == (archive_string_conv *)0x0) {
    paVar2 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    tar->sconv_acl = paVar2;
    if (paVar2 == (archive_string_conv *)0x0) {
      return L'\xffffffe2';
    }
  }
  acl = archive_entry_acl(entry);
  wVar1 = archive_acl_from_text_l(acl,value,type,tar->sconv_acl);
  if (wVar1 != L'\0') {
    if (wVar1 == L'\xffffffe2') {
      archive_set_error(&a->archive,0xc,"%s %s","Can\'t allocate memory for ",pcVar3);
      return L'\xffffffe2';
    }
    archive_set_error(&a->archive,-1,"%s %s","Parse error: ",pcVar3);
    return wVar1;
  }
  return L'\0';
}

Assistant:

static int
pax_attribute_acl(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const char *value, int type)
{
	int r;
	const char* errstr;

	switch (type) {
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
		errstr = "SCHILY.acl.access";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		errstr = "SCHILY.acl.default";
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		errstr = "SCHILY.acl.ace";
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unknown ACL type: %d", type);
		return(ARCHIVE_FATAL);
	}

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl =
		    archive_string_conversion_from_charset(
			&(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL)
			return (ARCHIVE_FATAL);
	}

	r = archive_acl_from_text_l(archive_entry_acl(entry), value, type,
	    tar->sconv_acl);
	if (r != ARCHIVE_OK) {
		if (r == ARCHIVE_FATAL) {
			archive_set_error(&a->archive, ENOMEM,
			    "%s %s", "Can't allocate memory for ",
			    errstr);
			return (r);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC, "%s %s", "Parse error: ", errstr);
	}
	return (r);
}